

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TableUpdateLayout(ImGuiTable *table)

{
  float x2;
  byte bVar1;
  ImGuiWindow *pIVar2;
  bool bVar3;
  ImGuiTableColumnFlags IVar4;
  ImU32 id;
  ImGuiTableColumn *pIVar5;
  char *pcVar6;
  ImGuiTableColumn *pIVar7;
  byte *pbVar8;
  uint uVar9;
  bool bVar10;
  float rhs;
  float fVar11;
  float fVar12;
  float y2;
  float fVar13;
  byte local_159;
  bool local_152;
  float local_150;
  float local_128;
  float local_124;
  float local_11c;
  ImGuiWindow *inner_window;
  float local_f8;
  ImGuiID context_menu_id;
  float unused_x1;
  float max_width;
  ImGuiTableColumn *column_4;
  int local_e0;
  int column_n_2;
  int order_n_2;
  ImRect host_clip_rect;
  float offset_x;
  int visible_n;
  bool is_hovering_table;
  ImRect mouse_hit_rect;
  ImGuiTableColumn *column_3;
  int order_n_1;
  ImGuiTableColumn *next_column;
  float weight_ratio;
  ImGuiTableColumn *column_2;
  int order_n;
  int count_resizable;
  float width_remaining_for_stretched_columns;
  float width_avail_for_stretched_columns;
  float width_avail;
  float width_spacings;
  ImGuiTableColumn *column_1;
  int column_n_1;
  float fStack_5c;
  bool mixed_same_widths;
  float default_weight;
  float width_auto;
  float content_width_headers;
  float content_width_body;
  ImGuiTableColumn *column;
  float local_40;
  int column_n;
  float max_width_auto;
  float sum_width_fixed_requests;
  float sum_weights_stretched;
  int count_fixed;
  float min_column_distance;
  float min_column_width;
  ImRect work_rect;
  ImGuiContext *g;
  ImGuiTable *table_local;
  
  work_rect.Max = (ImVec2)GImGui;
  if ((table->IsLayoutLocked & 1U) != 0) {
    __assert_fail("table->IsLayoutLocked == false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                  ,0x2342,"void ImGui::TableUpdateLayout(ImGuiTable *)");
  }
  table->HoveredColumnBody = -1;
  table->HoveredColumnBorder = -1;
  _min_column_distance = (table->WorkRect).Min;
  work_rect.Min = (table->WorkRect).Max;
  rhs = TableGetMinColumnWidth();
  fVar11 = table->CellPaddingX + table->CellPaddingX + rhs + table->CellSpacingX1 +
           table->CellSpacingX2;
  sum_width_fixed_requests = 0.0;
  max_width_auto = 0.0;
  column_n = 0;
  local_40 = 0.0;
  table->LeftMostStretchedColumnDisplayOrder = -1;
  column._4_4_ = 0;
  do {
    if (table->ColumnsCount <= column._4_4_) {
      table->ColumnsVisibleFixedCount = SUB41(sum_width_fixed_requests,0);
      bVar10 = (table->Flags & 0x10000U) == 0;
      if ((table->Flags & 0x10000U) != 0) {
        for (column_1._0_4_ = 0; (int)column_1 < table->ColumnsCount;
            column_1._0_4_ = (int)column_1 + 1) {
          if ((table->VisibleMaskByIndex & 1L << ((byte)(int)column_1 & 0x3f)) != 0) {
            pIVar5 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)column_1);
            if ((pIVar5->Flags & 0x18U) == 0) {
              max_width_auto = (1.0 - pIVar5->StretchWeight) + max_width_auto;
              pIVar5->StretchWeight = 1.0;
              if (0 < (int)sum_width_fixed_requests) {
                pIVar5->WidthRequest = local_40;
              }
            }
            else {
              column_n = (int)((local_40 - pIVar5->WidthRequest) + (float)column_n);
              pIVar5->WidthRequest = local_40;
            }
          }
        }
      }
      fVar12 = table->OuterPaddingX + table->OuterPaddingX +
               (table->CellSpacingX1 + table->CellSpacingX2) *
               (float)(table->ColumnsVisibleCount + -1);
      if ((((table->Flags & 0x2000000U) == 0) || (table->InnerWidth != 0.0)) ||
         (NAN(table->InnerWidth))) {
        local_124 = ImRect::GetWidth((ImRect *)&min_column_distance);
      }
      else {
        local_124 = ImRect::GetWidth(&table->InnerClipRect);
      }
      if (bVar10 || (int)sum_width_fixed_requests < 1) {
        local_128 = (local_124 - fVar12) - (float)column_n;
      }
      else {
        local_128 = 0.0;
      }
      order_n = (int)local_128;
      column_2._4_4_ = 0;
      table->ColumnsTotalWidth = fVar12;
      table->ColumnsAutoFitWidth = fVar12;
      for (column_2._0_4_ = 0; (int)column_2 < table->ColumnsCount;
          column_2._0_4_ = (int)column_2 + 1) {
        if ((table->VisibleMaskByDisplayOrder & 1L << ((byte)(int)column_2 & 0x3f)) != 0) {
          pcVar6 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,(int)column_2);
          pIVar5 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)*pcVar6);
          if ((pIVar5->Flags & 4U) != 0) {
            if (bVar10 || (int)sum_width_fixed_requests < 1) {
              fVar12 = ImMax<float>(local_128 * (pIVar5->StretchWeight / max_width_auto),rhs);
              pIVar5->WidthRequest = (float)(int)(fVar12 + 0.01);
              order_n = (int)((float)order_n - pIVar5->WidthRequest);
            }
            if (((pIVar5->NextVisibleColumn != -1) &&
                (pIVar7 = ImSpan<ImGuiTableColumn>::operator[]
                                    (&table->Columns,(int)pIVar5->NextVisibleColumn),
                pIVar7 != (ImGuiTableColumn *)0x0)) && ((pIVar7->Flags & 8U) != 0)) {
              pIVar5->Flags = pIVar7->Flags & 0x40000000U | pIVar5->Flags;
            }
          }
          if ((pIVar5->NextVisibleColumn == -1) &&
             (table->LeftMostStretchedColumnDisplayOrder != -1)) {
            pIVar5->Flags = pIVar5->Flags | 0x40000000;
          }
          if ((pIVar5->Flags & 0x20U) == 0) {
            column_2._4_4_ = column_2._4_4_ + 1;
          }
          fVar12 = ImMax<float>(pIVar5->WidthRequest,rhs);
          fVar12 = ImFloor(fVar12);
          pIVar5->WidthGiven = fVar12;
          table->ColumnsTotalWidth =
               table->CellPaddingX + table->CellPaddingX + pIVar5->WidthGiven +
               table->ColumnsTotalWidth;
          table->ColumnsAutoFitWidth =
               table->CellPaddingX + table->CellPaddingX + pIVar5->WidthAuto +
               table->ColumnsAutoFitWidth;
        }
      }
      if ((1.0 <= (float)order_n) && ((table->Flags & 0x100000U) == 0)) {
        column_3._4_4_ = table->ColumnsCount;
        while( true ) {
          column_3._4_4_ = column_3._4_4_ + -1;
          bVar10 = false;
          if ((0.0 < max_width_auto) && (bVar10 = false, 1.0 <= (float)order_n)) {
            bVar10 = -1 < column_3._4_4_;
          }
          if (!bVar10) break;
          if ((table->VisibleMaskByDisplayOrder & 1L << ((byte)column_3._4_4_ & 0x3f)) != 0) {
            pcVar6 = ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,column_3._4_4_);
            mouse_hit_rect.Max =
                 (ImVec2)ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)*pcVar6);
            if ((*(ImGuiTableColumnFlags *)((long)mouse_hit_rect.Max + 0x18) & 4U) != 0) {
              *(float *)((long)mouse_hit_rect.Max + 0x30) =
                   *(float *)((long)mouse_hit_rect.Max + 0x30) + 1.0;
              *(float *)((long)mouse_hit_rect.Max + 0x34) =
                   *(float *)((long)mouse_hit_rect.Max + 0x34) + 1.0;
              order_n = (int)((float)order_n - 1.0);
            }
          }
        }
      }
      fVar12 = (table->OuterRect).Min.x;
      fVar13 = (table->OuterRect).Min.y;
      x2 = (table->OuterRect).Max.x;
      y2 = ImMax<float>((table->OuterRect).Max.y,(table->OuterRect).Min.y + table->LastOuterHeight);
      ImRect::ImRect((ImRect *)&visible_n,fVar12,fVar13,x2,y2);
      bVar10 = ItemHoverable((ImRect *)&visible_n,0);
      host_clip_rect.Max.y = 0.0;
      if (table->FreezeColumnsCount < '\x01') {
        local_150 = min_column_distance;
      }
      else {
        local_150 = (table->OuterRect).Min.x;
      }
      host_clip_rect.Max.x = (table->OuterPaddingX + local_150) - table->CellSpacingX1;
      _column_n_2 = (table->InnerClipRect).Min;
      host_clip_rect.Min = (table->InnerClipRect).Max;
      for (local_e0 = 0; local_e0 < table->ColumnsCount; local_e0 = local_e0 + 1) {
        pbVar8 = (byte *)ImSpan<signed_char>::operator[](&table->DisplayOrderToIndex,local_e0);
        bVar1 = *pbVar8;
        pIVar5 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,(int)(char)bVar1);
        bVar3 = true;
        if (table->FreezeRowsCount < '\x01') {
          bVar3 = (int)(char)bVar1 < (int)table->FreezeColumnsCount;
        }
        pIVar5->NavLayerCurrent = bVar3;
        if (('\0' < table->FreezeColumnsCount) &&
           ((float)(int)table->FreezeColumnsCount == host_clip_rect.Max.y)) {
          host_clip_rect.Max.x =
               (min_column_distance - (table->OuterRect).Min.x) + host_clip_rect.Max.x;
        }
        if ((table->VisibleMaskByDisplayOrder & 1L << ((byte)local_e0 & 0x3f)) == 0) {
          (pIVar5->ClipRect).Max.x = host_clip_rect.Max.x;
          (pIVar5->ClipRect).Min.x = host_clip_rect.Max.x;
          pIVar5->WorkMinX = host_clip_rect.Max.x;
          pIVar5->MaxX = host_clip_rect.Max.x;
          pIVar5->MinX = host_clip_rect.Max.x;
          pIVar5->WidthGiven = 0.0;
          (pIVar5->ClipRect).Min.y = min_column_width;
          (pIVar5->ClipRect).Max.y = 3.4028235e+38;
          ImRect::ClipWithFull(&pIVar5->ClipRect,(ImRect *)&column_n_2);
          pIVar5->IsSkipItems = true;
          pIVar5->IsClipped = true;
          pIVar5->ItemWidth = 1.0;
        }
        else {
          context_menu_id = 0x7f7fffff;
          if ((table->Flags & 0x2000000U) == 0) {
            if ((table->Flags & 0x80000U) == 0) {
              context_menu_id =
                   (ImGuiID)((-table->CellPaddingX + -table->CellPaddingX +
                             (((-(float)(((int)table->ColumnsVisibleCount -
                                         (int)pIVar5->IndexWithinVisibleSet) + -1) * fVar11 +
                               (table->WorkRect).Max.x) - host_clip_rect.Max.x) -
                             table->CellSpacingX2)) - table->OuterPaddingX);
            }
          }
          else if (local_e0 < table->FreezeColumnsRequest) {
            context_menu_id =
                 (ImGuiID)(((((-(float)(table->FreezeColumnsRequest - local_e0) * fVar11 +
                              (table->InnerClipRect).Max.x) - host_clip_rect.Max.x) -
                            table->OuterPaddingX) - table->CellPaddingX) - table->CellSpacingX2);
          }
          fVar12 = ImMin<float>(pIVar5->WidthGiven,(float)context_menu_id);
          pIVar5->WidthGiven = fVar12;
          fVar12 = pIVar5->WidthGiven;
          fVar13 = ImMin<float>(pIVar5->WidthRequest,rhs);
          fVar12 = ImMax<float>(fVar12,fVar13);
          pIVar5->WidthGiven = fVar12;
          pIVar5->MinX = host_clip_rect.Max.x;
          pIVar5->MaxX = table->CellPaddingX + table->CellPaddingX +
                         host_clip_rect.Max.x + pIVar5->WidthGiven + table->CellSpacingX1 +
                         table->CellSpacingX2;
          pIVar5->WorkMinX = pIVar5->MinX + table->CellPaddingX + table->CellSpacingX1;
          pIVar5->WorkMaxX = (pIVar5->MaxX - table->CellPaddingX) - table->CellSpacingX2;
          fVar12 = ImFloor(pIVar5->WidthGiven * 0.65);
          pIVar5->ItemWidth = fVar12;
          (pIVar5->ClipRect).Min.x = pIVar5->MinX;
          (pIVar5->ClipRect).Min.y = min_column_width;
          (pIVar5->ClipRect).Max.x = pIVar5->MaxX;
          (pIVar5->ClipRect).Max.y = 3.4028235e+38;
          ImRect::ClipWithFull(&pIVar5->ClipRect,(ImRect *)&column_n_2);
          local_152 = false;
          if (((pIVar5->ClipRect).Max.x <= (pIVar5->ClipRect).Min.x) &&
             (local_152 = false, (pIVar5->AutoFitQueue & 1) == 0)) {
            local_152 = (pIVar5->CannotSkipItemsQueue & 1) == 0;
          }
          pIVar5->IsClipped = local_152;
          if ((pIVar5->IsClipped & 1U) != 0) {
            table->VisibleUnclippedMaskByIndex =
                 (1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) & table->VisibleUnclippedMaskByIndex;
          }
          local_159 = 1;
          if ((pIVar5->IsVisible & 1U) != 0) {
            local_159 = table->HostSkipItems;
          }
          pIVar5->IsSkipItems = (bool)(local_159 & 1);
          if (((bVar10) && ((pIVar5->ClipRect).Min.x <= *(float *)((long)work_rect.Max + 0x120))) &&
             (*(float *)((long)work_rect.Max + 0x120) < (pIVar5->ClipRect).Max.x)) {
            table->HoveredColumnBody = bVar1;
          }
          pIVar5->ContentMaxXUnfrozen = pIVar5->WorkMinX;
          pIVar5->ContentMaxXFrozen = pIVar5->WorkMinX;
          pIVar5->ContentMaxXHeadersIdeal = pIVar5->WorkMinX;
          pIVar5->ContentMaxXHeadersUsed = pIVar5->WorkMinX;
          if ((table->HostSkipItems & 1U) == 0) {
            pIVar5->AutoFitQueue = (ImU8)((int)(uint)pIVar5->AutoFitQueue >> 1);
            pIVar5->CannotSkipItemsQueue = (ImU8)((int)(uint)pIVar5->CannotSkipItemsQueue >> 1);
          }
          if ((int)host_clip_rect.Max.y < (int)table->FreezeColumnsCount) {
            fVar12 = ImMax<float>((float)column_n_2,pIVar5->MaxX + 1.0);
            column_n_2 = (int)fVar12;
          }
          host_clip_rect.Max.x =
               table->CellPaddingX + table->CellPaddingX +
               pIVar5->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 +
               host_clip_rect.Max.x;
          host_clip_rect.Max.y = (float)((int)host_clip_rect.Max.y + 1);
        }
      }
      if ((bVar10) && (table->HoveredColumnBody == -1)) {
        local_f8 = (table->WorkRect).Min.x;
        if (table->RightMostVisibleColumn != -1) {
          pIVar5 = ImSpan<ImGuiTableColumn>::operator[]
                             (&table->Columns,(int)table->RightMostVisibleColumn);
          local_f8 = ImMax<float>(local_f8,(pIVar5->ClipRect).Max.x);
        }
        if (local_f8 <= *(float *)((long)work_rect.Max + 0x120)) {
          table->HoveredColumnBody = (ImS8)table->ColumnsCount;
        }
      }
      if ((column_2._4_4_ == 0) && ((table->Flags & 1U) != 0)) {
        table->Flags = table->Flags & 0xfffffffe;
      }
      TableUpdateDrawChannels(table);
      if ((table->Flags & 1U) != 0) {
        TableUpdateBorders(table);
      }
      table->LastFirstRowHeight = 0.0;
      table->IsLayoutLocked = true;
      table->IsUsingHeaders = false;
      if (((table->IsContextPopupOpen & 1U) != 0) &&
         (table->InstanceCurrent == table->InstanceInteracted)) {
        id = ImHashStr("##ContextMenu",0,table->ID);
        bVar10 = BeginPopupEx(id,0x141);
        if (bVar10) {
          TableDrawContextMenu(table);
          EndPopup();
        }
        else {
          table->IsContextPopupOpen = false;
        }
      }
      pIVar2 = table->InnerWindow;
      if ((table->Flags & 0x200000U) == 0) {
        ImDrawList::PushClipRect
                  (pIVar2->DrawList,(pIVar2->ClipRect).Min,(pIVar2->ClipRect).Max,false);
      }
      else {
        ImDrawListSplitter::SetCurrentChannel(&table->DrawSplitter,pIVar2->DrawList,2);
      }
      if (((table->IsSortSpecsDirty & 1U) != 0) && ((table->Flags & 8U) != 0)) {
        TableSortSpecsBuild(table);
      }
      return;
    }
    if ((table->VisibleMaskByIndex & 1L << ((byte)column._4_4_ & 0x3f)) != 0) {
      pIVar5 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column._4_4_);
      IVar4 = TableFixColumnFlags(table,pIVar5->FlagsIn);
      pIVar5->Flags = IVar4;
      if ((pIVar5->Flags & 0x18000U) == 0) {
        uVar9 = 0x10000;
        if (column._4_4_ == 0) {
          uVar9 = 0x8000;
        }
        pIVar5->Flags = uVar9 | pIVar5->Flags;
      }
      if ((table->Flags & 8U) != 0) {
        TableFixColumnSortDirection(pIVar5);
      }
      fStack_5c = ImMax<float>(pIVar5->ContentMaxXFrozen,pIVar5->ContentMaxXUnfrozen);
      fStack_5c = fStack_5c - pIVar5->WorkMinX;
      if (((table->Flags & 0x20000U) == 0) && ((pIVar5->Flags & 0x1000U) == 0)) {
        fStack_5c = ImMax<float>(fStack_5c,pIVar5->ContentMaxXHeadersIdeal - pIVar5->WorkMinX);
      }
      fStack_5c = ImMax<float>(fStack_5c,rhs);
      if ((((pIVar5->Flags & 8U) != 0) && (0.0 < pIVar5->InitStretchWeightOrWidth)) &&
         (((table->Flags & 1U) == 0 || ((pIVar5->Flags & 0x20U) == 0)))) {
        fStack_5c = ImMax<float>(fStack_5c,pIVar5->InitStretchWeightOrWidth);
      }
      pIVar5->WidthAuto = fStack_5c;
      if ((pIVar5->Flags & 0x18U) == 0) {
        if ((pIVar5->Flags & 4U) == 0) {
          __assert_fail("column->Flags & ImGuiTableColumnFlags_WidthStretch",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui_widgets.cpp"
                        ,0x2387,"void ImGui::TableUpdateLayout(ImGuiTable *)");
        }
        if (pIVar5->InitStretchWeightOrWidth <= 0.0) {
          local_11c = 1.0;
        }
        else {
          local_11c = pIVar5->InitStretchWeightOrWidth;
        }
        if (pIVar5->AutoFitQueue != '\0') {
          pIVar5->StretchWeight = local_11c;
        }
        max_width_auto = pIVar5->StretchWeight + max_width_auto;
        if ((table->LeftMostStretchedColumnDisplayOrder == -1) ||
           (pIVar5->DisplayOrder < table->LeftMostStretchedColumnDisplayOrder)) {
          table->LeftMostStretchedColumnDisplayOrder = pIVar5->DisplayOrder;
        }
      }
      else {
        if ((pIVar5->AutoFitQueue != '\0') ||
           (((pIVar5->Flags & 0x10U) != 0 && ((pIVar5->IsClipped & 1U) == 0)))) {
          pIVar5->WidthRequest = fStack_5c;
        }
        if ((1 < pIVar5->AutoFitQueue) && ((table->IsInitializing & 1U) != 0)) {
          fVar12 = ImMax<float>(pIVar5->WidthRequest,rhs * 4.0);
          pIVar5->WidthRequest = fVar12;
        }
        sum_width_fixed_requests = (float)((int)sum_width_fixed_requests + 1);
        column_n = (int)(pIVar5->WidthRequest + (float)column_n);
      }
      local_40 = ImMax<float>(local_40,fStack_5c);
      column_n = (int)(table->CellPaddingX + table->CellPaddingX + (float)column_n);
    }
    column._4_4_ = column._4_4_ + 1;
  } while( true );
}

Assistant:

void    ImGui::TableUpdateLayout(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->IsLayoutLocked == false);

    table->HoveredColumnBody = -1;
    table->HoveredColumnBorder = -1;

    // Compute offset, clip rect for the frame
    // (can't make auto padding larger than what WorkRect knows about so right-alignment matches)
    const ImRect work_rect = table->WorkRect;
    const float min_column_width = TableGetMinColumnWidth();
    const float min_column_distance = min_column_width + table->CellPaddingX * 2.0f + table->CellSpacingX1 + table->CellSpacingX2;

    int count_fixed = 0;
    float sum_weights_stretched = 0.0f;     // Sum of all weights for weighted columns.
    float sum_width_fixed_requests = 0.0f;  // Sum of all width for fixed and auto-resize columns, excluding width contributed by Stretch columns.
    float max_width_auto = 0.0f;
    table->LeftMostStretchedColumnDisplayOrder = -1;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if (!(table->VisibleMaskByIndex & ((ImU64)1 << column_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        // Adjust flags: default width mode + weighted columns are not allowed when auto extending
        // FIXME-TABLE: Clarify why we need to do this again here and not just in TableSetupColumn()
        column->Flags = TableFixColumnFlags(table, column->FlagsIn);
        if ((column->Flags & ImGuiTableColumnFlags_IndentMask_) == 0)
            column->Flags |= (column_n == 0) ? ImGuiTableColumnFlags_IndentEnable : ImGuiTableColumnFlags_IndentDisable;

        // We have a unusual edge case where if the user doesn't call TableGetSortSpecs() but has sorting enabled
        // or varying sorting flags, we still want the sorting arrows to honor those flags.
        if (table->Flags & ImGuiTableFlags_Sortable)
            TableFixColumnSortDirection(column);

        // Calculate "ideal" column width for nothing to be clipped.
        // Combine width from regular rows + width from headers unless requested not to.
        const float content_width_body = (float)ImMax(column->ContentMaxXFrozen, column->ContentMaxXUnfrozen) - column->WorkMinX;
        const float content_width_headers = (float)column->ContentMaxXHeadersIdeal - column->WorkMinX;
        float width_auto = content_width_body;
        if (!(table->Flags & ImGuiTableFlags_NoHeadersWidth) && !(column->Flags & ImGuiTableColumnFlags_NoHeaderWidth))
            width_auto = ImMax(width_auto, content_width_headers);
        width_auto = ImMax(width_auto, min_column_width);

        // Non-resizable columns also submit their requested width
        if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && column->InitStretchWeightOrWidth > 0.0f)
            if (!(table->Flags & ImGuiTableFlags_Resizable) || !(column->Flags & ImGuiTableColumnFlags_NoResize))
                width_auto = ImMax(width_auto, column->InitStretchWeightOrWidth);

        column->WidthAuto = width_auto;

        if (column->Flags & (ImGuiTableColumnFlags_WidthFixed | ImGuiTableColumnFlags_WidthAutoResize))
        {
            // Process auto-fit for non-stretched columns
            // Latch initial size for fixed columns and update it constantly for auto-resizing column (unless clipped!)
            if ((column->AutoFitQueue != 0x00) || ((column->Flags & ImGuiTableColumnFlags_WidthAutoResize) && !column->IsClipped))
                column->WidthRequest = width_auto;

            // FIXME-TABLE: Increase minimum size during init frame to avoid biasing auto-fitting widgets
            // (e.g. TextWrapped) too much. Otherwise what tends to happen is that TextWrapped would output a very
            // large height (= first frame scrollbar display very off + clipper would skip lots of items).
            // This is merely making the side-effect less extreme, but doesn't properly fixes it.
            // FIXME: Move this to ->WidthGiven to avoid temporary lossyless?
            if (column->AutoFitQueue > 0x01 && table->IsInitializing)
                column->WidthRequest = ImMax(column->WidthRequest, min_column_width * 4.0f); // FIXME-TABLE: Another constant/scale?

            count_fixed += 1;
            sum_width_fixed_requests += column->WidthRequest;
        }
        else
        {
            IM_ASSERT(column->Flags & ImGuiTableColumnFlags_WidthStretch);
            const float default_weight = (column->InitStretchWeightOrWidth > 0.0f) ? column->InitStretchWeightOrWidth : 1.0f;
            if (column->AutoFitQueue != 0x00)
                column->StretchWeight = default_weight;
            sum_weights_stretched += column->StretchWeight;
            if (table->LeftMostStretchedColumnDisplayOrder == -1 || table->LeftMostStretchedColumnDisplayOrder > column->DisplayOrder)
                table->LeftMostStretchedColumnDisplayOrder = (ImS8)column->DisplayOrder;
        }
        max_width_auto = ImMax(max_width_auto, width_auto);
        sum_width_fixed_requests += table->CellPaddingX * 2.0f;
    }
    table->ColumnsVisibleFixedCount = (ImS8)count_fixed;

    // Apply "same widths"
    // - When all columns are fixed or columns are of mixed type: use the maximum auto width
    // - When all columns are stretch: use same weight
    const bool mixed_same_widths = (table->Flags & ImGuiTableFlags_SameWidths) && count_fixed > 0;
    if (table->Flags & ImGuiTableFlags_SameWidths)
    {
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            if (table->VisibleMaskByIndex & ((ImU64)1 << column_n))
            {
                ImGuiTableColumn* column = &table->Columns[column_n];
                if (column->Flags & (ImGuiTableColumnFlags_WidthFixed | ImGuiTableColumnFlags_WidthAutoResize))
                {
                    sum_width_fixed_requests += max_width_auto - column->WidthRequest; // Update old sum
                    column->WidthRequest = max_width_auto;
                }
                else
                {
                    sum_weights_stretched += 1.0f - column->StretchWeight; // Update old sum
                    column->StretchWeight = 1.0f;
                    if (count_fixed > 0)
                        column->WidthRequest = max_width_auto;
                }
            }
    }

    // Layout
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsVisibleCount - 1);
    const float width_avail = ((table->Flags & ImGuiTableFlags_ScrollX) && table->InnerWidth == 0.0f) ? table->InnerClipRect.GetWidth() : work_rect.GetWidth();
    const float width_avail_for_stretched_columns = mixed_same_widths ? 0.0f : width_avail - width_spacings - sum_width_fixed_requests;
    float width_remaining_for_stretched_columns = width_avail_for_stretched_columns;

    // Apply final width based on requested widths
    // Mark some columns as not resizable
    int count_resizable = 0;
    table->ColumnsTotalWidth = width_spacings;
    table->ColumnsAutoFitWidth = width_spacings;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;
        ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];

        // Allocate width for stretched/weighted columns
        if (column->Flags & ImGuiTableColumnFlags_WidthStretch)
        {
            // StretchWeight gets converted into WidthRequest
            if (!mixed_same_widths) 
            {
                float weight_ratio = column->StretchWeight / sum_weights_stretched;
                column->WidthRequest = IM_FLOOR(ImMax(width_avail_for_stretched_columns * weight_ratio, min_column_width) + 0.01f);
                width_remaining_for_stretched_columns -= column->WidthRequest;
            }

            // [Resize Rule 2] Resizing from right-side of a stretch column preceding a fixed column
            // needs to forward resizing to left-side of fixed column. We also need to copy the NoResize flag..
            if (column->NextVisibleColumn != -1)
                if (ImGuiTableColumn* next_column = &table->Columns[column->NextVisibleColumn])
                    if (next_column->Flags & ImGuiTableColumnFlags_WidthFixed)
                        column->Flags |= (next_column->Flags & ImGuiTableColumnFlags_NoDirectResize_);
        }

        // [Resize Rule 1] The right-most Visible column is not resizable if there is at least one Stretch column
        // (see comments in TableResizeColumn())
        if (column->NextVisibleColumn == -1 && table->LeftMostStretchedColumnDisplayOrder != -1)
            column->Flags |= ImGuiTableColumnFlags_NoDirectResize_;

        if (!(column->Flags & ImGuiTableColumnFlags_NoResize))
            count_resizable++;

        // Assign final width, record width in case we will need to shrink
        column->WidthGiven = ImFloor(ImMax(column->WidthRequest, min_column_width));
        table->ColumnsTotalWidth += column->WidthGiven + table->CellPaddingX * 2.0f;
        table->ColumnsAutoFitWidth += column->WidthAuto + table->CellPaddingX * 2.0f;
    }

    // Redistribute remainder width due to rounding (remainder width is < 1.0f * number of Stretch column).
    // Using right-to-left distribution (more likely to match resizing cursor), could be adjusted depending
    // on where the mouse cursor is and/or relative weights.
    if (width_remaining_for_stretched_columns >= 1.0f && !(table->Flags & ImGuiTableFlags_PreciseWidths))
        for (int order_n = table->ColumnsCount - 1; sum_weights_stretched > 0.0f && width_remaining_for_stretched_columns >= 1.0f && order_n >= 0; order_n--)
        {
            if (!(table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)))
                continue;
            ImGuiTableColumn* column = &table->Columns[table->DisplayOrderToIndex[order_n]];
            if (!(column->Flags & ImGuiTableColumnFlags_WidthStretch))
                continue;
            column->WidthRequest += 1.0f;
            column->WidthGiven += 1.0f;
            width_remaining_for_stretched_columns -= 1.0f;
        }

    // Detect hovered column
    const ImRect mouse_hit_rect(table->OuterRect.Min.x, table->OuterRect.Min.y, table->OuterRect.Max.x, ImMax(table->OuterRect.Max.y, table->OuterRect.Min.y + table->LastOuterHeight));
    const bool is_hovering_table = ItemHoverable(mouse_hit_rect, 0);

    // Setup final position, offset and clipping rectangles
    int visible_n = 0;
    float offset_x = (table->FreezeColumnsCount > 0) ? table->OuterRect.Min.x : work_rect.Min.x;
    offset_x += table->OuterPaddingX;
    offset_x -= table->CellSpacingX1;
    ImRect host_clip_rect = table->InnerClipRect;
    //host_clip_rect.Max.x += table->CellPaddingX + table->CellSpacingX2;
    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];

        column->NavLayerCurrent = (ImS8)((table->FreezeRowsCount > 0 || column_n < table->FreezeColumnsCount) ? ImGuiNavLayer_Menu : ImGuiNavLayer_Main);

        if (table->FreezeColumnsCount > 0 && table->FreezeColumnsCount == visible_n)
            offset_x += work_rect.Min.x - table->OuterRect.Min.x;

        if ((table->VisibleMaskByDisplayOrder & ((ImU64)1 << order_n)) == 0)
        {
            // Hidden column: clear a few fields and we are done with it for the remainder of the function.
            // We set a zero-width clip rect but set Min.y/Max.y properly to not interfere with the clipper.
            column->MinX = column->MaxX = column->WorkMinX = column->ClipRect.Min.x = column->ClipRect.Max.x = offset_x;
            column->WidthGiven = 0.0f;
            column->ClipRect.Min.y = work_rect.Min.y;
            column->ClipRect.Max.y = FLT_MAX;
            column->ClipRect.ClipWithFull(host_clip_rect);
            column->IsClipped = column->IsSkipItems = true;
            column->ItemWidth = 1.0f;
            continue;
        }

        // Maximum width
        float max_width = FLT_MAX;
        if (table->Flags & ImGuiTableFlags_ScrollX)
        {
            // Frozen columns can't reach beyond visible width else scrolling will naturally break.
            if (order_n < table->FreezeColumnsRequest)
            {
                max_width = (table->InnerClipRect.Max.x - (table->FreezeColumnsRequest - order_n) * min_column_distance) - offset_x;
                max_width = max_width - table->OuterPaddingX - table->CellPaddingX - table->CellSpacingX2;
            }
        }
        else if ((table->Flags & ImGuiTableFlags_NoKeepColumnsVisible) == 0)
        {
            // If horizontal scrolling if disabled, we apply a final lossless shrinking of columns in order to make
            // sure they are all visible. Because of this we also know that all of the columns will always fit in
            // table->WorkRect and therefore in table->InnerRect (because ScrollX is off)
            // FIXME-TABLE: This is solved incorrectly but also quite a difficult problem to fix as we also want ClipRect width to match.
            // See "table_width_distrib" and "table_width_keep_visible" tests
            max_width = table->WorkRect.Max.x - (table->ColumnsVisibleCount - column->IndexWithinVisibleSet - 1) * min_column_distance - offset_x;
            //max_width -= table->CellSpacingX1;
            max_width -= table->CellSpacingX2;
            max_width -= table->CellPaddingX * 2.0f;
            max_width -= table->OuterPaddingX;
        }
        column->WidthGiven = ImMin(column->WidthGiven, max_width);

        // Minimum width
        column->WidthGiven = ImMax(column->WidthGiven, ImMin(column->WidthRequest, min_column_width));

        // Lock all our positions
        // - ClipRect.Min.x: Because merging draw commands doesn't compare min boundaries, we make ClipRect.Min.x match left bounds to be consistent regardless of merging.
        // - ClipRect.Max.x: using WorkMaxX instead of MaxX (aka including padding) is detrimental to visibility in very-small column.
        // - FIXME-TABLE: We want equal width columns to have equal (ClipRect.Max.x - WorkMinX) width, which means ClipRect.max.x cannot stray off host_clip_rect.Max.x else right-most column may appear shorter.
        column->MinX = offset_x;
        column->MaxX = offset_x + column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        column->WorkMinX = column->MinX + table->CellPaddingX + table->CellSpacingX1;
        column->WorkMaxX = column->MaxX - table->CellPaddingX - table->CellSpacingX2; // Expected max
        column->ItemWidth = ImFloor(column->WidthGiven * 0.65f);
        column->ClipRect.Min.x = column->MinX;
        column->ClipRect.Min.y = work_rect.Min.y;
        column->ClipRect.Max.x = column->MaxX; // column->WorkMaxX;
        column->ClipRect.Max.y = FLT_MAX;
        column->ClipRect.ClipWithFull(host_clip_rect);

        column->IsClipped = (column->ClipRect.Max.x <= column->ClipRect.Min.x) && (column->AutoFitQueue & 1) == 0 && (column->CannotSkipItemsQueue & 1) == 0;
        if (column->IsClipped)
            table->VisibleUnclippedMaskByIndex &= ~((ImU64)1 << column_n); // Columns with the _WidthAutoResize sizing policy will never be updated then.

        column->IsSkipItems = !column->IsVisible || table->HostSkipItems;

        // Detect hovered column
        if (is_hovering_table && g.IO.MousePos.x >= column->ClipRect.Min.x && g.IO.MousePos.x < column->ClipRect.Max.x)
            table->HoveredColumnBody = (ImS8)column_n;

        // Alignment
        // FIXME-TABLE: This align based on the whole column width, not per-cell, and therefore isn't useful in
        // many cases (to be able to honor this we might be able to store a log of cells width, per row, for
        // visible rows, but nav/programmatic scroll would have visible artifacts.)
        //if (column->Flags & ImGuiTableColumnFlags_AlignRight)
        //    column->WorkMinX = ImMax(column->WorkMinX, column->MaxX - column->ContentWidthRowsUnfrozen);
        //else if (column->Flags & ImGuiTableColumnFlags_AlignCenter)
        //    column->WorkMinX = ImLerp(column->WorkMinX, ImMax(column->StartX, column->MaxX - column->ContentWidthRowsUnfrozen), 0.5f);

        // Reset content width variables
        column->ContentMaxXFrozen = column->ContentMaxXUnfrozen = column->WorkMinX;
        column->ContentMaxXHeadersUsed = column->ContentMaxXHeadersIdeal = column->WorkMinX;

        // Don't decrement auto-fit counters until container window got a chance to submit its items
        if (table->HostSkipItems == false)
        {
            column->AutoFitQueue >>= 1;
            column->CannotSkipItemsQueue >>= 1;
        }

        if (visible_n < table->FreezeColumnsCount)
            host_clip_rect.Min.x = ImMax(host_clip_rect.Min.x, column->MaxX + TABLE_BORDER_SIZE);

        offset_x += column->WidthGiven + table->CellSpacingX1 + table->CellSpacingX2 + table->CellPaddingX * 2.0f;
        visible_n++;
    }

    // Detect/store when we are hovering the unused space after the right-most column (so e.g. context menus can react on it)
    if (is_hovering_table && table->HoveredColumnBody == -1)
    {
        float unused_x1 = table->WorkRect.Min.x;
        if (table->RightMostVisibleColumn != -1)
            unused_x1 = ImMax(unused_x1, table->Columns[table->RightMostVisibleColumn].ClipRect.Max.x);
        if (g.IO.MousePos.x >= unused_x1)
            table->HoveredColumnBody = (ImS8)table->ColumnsCount;
    }

    // Clear Resizable flag if none of our column are actually resizable (either via an explicit _NoResize flag,
    // either because of using _WidthAutoResize/_WidthStretch).
    // This will hide the resizing option from the context menu.
    if (count_resizable == 0 && (table->Flags & ImGuiTableFlags_Resizable))
        table->Flags &= ~ImGuiTableFlags_Resizable;

    // Allocate draw channels
    TableUpdateDrawChannels(table);

    // Borders
    if (table->Flags & ImGuiTableFlags_Resizable)
        TableUpdateBorders(table);

    // Reset fields after we used them in TableSetupResize()
    table->LastFirstRowHeight = 0.0f;
    table->IsLayoutLocked = true;
    table->IsUsingHeaders = false;

    // Context menu
    if (table->IsContextPopupOpen && table->InstanceCurrent == table->InstanceInteracted)
    {
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        if (BeginPopupEx(context_menu_id, ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings))
        {
            TableDrawContextMenu(table);
            EndPopup();
        }
        else
        {
            table->IsContextPopupOpen = false;
        }
    }

    // Initial state
    ImGuiWindow* inner_window = table->InnerWindow;
    if (table->Flags & ImGuiTableFlags_NoClip)
        table->DrawSplitter.SetCurrentChannel(inner_window->DrawList, TABLE_DRAW_CHANNEL_UNCLIPPED);
    else
        inner_window->DrawList->PushClipRect(inner_window->ClipRect.Min, inner_window->ClipRect.Max, false);

    // Sanitize and build sort specs before we have a change to use them for display.
    // This path will only be exercised when sort specs are modified before header rows (e.g. init or visibility change)
    if (table->IsSortSpecsDirty && (table->Flags & ImGuiTableFlags_Sortable))
        TableSortSpecsBuild(table);
}